

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_Taproot_pubkey_Test::TestBody(Descriptor_Parse_Taproot_pubkey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference this_00;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_8;
  CfdException *except_1;
  AssertHelper local_1470;
  Message local_1468;
  bool local_1459;
  undefined1 local_1458 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_12e0;
  Message local_12d8;
  string local_12d0;
  undefined1 local_12b0 [8];
  AssertionResult gtest_ar_7;
  Message local_1298;
  string local_1290;
  undefined1 local_1270 [8];
  AssertionResult gtest_ar_6;
  Message local_1258;
  undefined1 local_1250 [8];
  AssertionResult gtest_ar_5;
  Message local_1238;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_1230;
  SchnorrPubkey local_1218;
  AssertHelper local_1200;
  Message local_11f8;
  Address local_11f0;
  string local_1078;
  undefined1 local_1058 [8];
  AssertionResult gtest_ar_4;
  Message local_1040;
  HashType local_1038 [2];
  undefined1 local_1030 [8];
  AssertionResult gtest_ar_3;
  Message local_1018;
  AddressType local_1010 [2];
  undefined1 local_1008 [8];
  AssertionResult gtest_ar_2;
  Message local_ff0;
  string local_fe8;
  AssertHelper local_fc8;
  Message local_fc0;
  Script local_fb8;
  string local_f80;
  AssertHelper local_f60;
  Message local_f58;
  bool local_f49;
  undefined1 local_f48 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_f18;
  Message local_f10;
  bool local_f01;
  undefined1 local_f00 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_ed0;
  Message local_ec8;
  bool local_eb9;
  undefined1 local_eb8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e88;
  Message local_e80;
  bool local_e71;
  undefined1 local_e70 [8];
  AssertionResult gtest_ar__2;
  Message local_e58;
  uint32_t local_e50 [2];
  undefined1 local_e48 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_e18;
  Message local_e10;
  bool local_e01;
  undefined1 local_e00 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_dd0;
  Message local_dc8;
  bool local_db9;
  undefined1 local_db8 [8];
  AssertionResult gtest_ar_;
  Message local_da0;
  DescriptorNode local_d98;
  AssertHelper local_c30;
  Message local_c28 [2];
  DescriptorScriptReference local_c18;
  AssertionResult gtest_ar;
  CfdException *except;
  undefined1 local_738 [8];
  DescriptorNode node;
  undefined1 local_5c8 [4];
  NetType nettype;
  SchnorrPubkey pubkey;
  DescriptorScriptReference script_ref;
  string local_258 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  undefined1 local_90 [8];
  string descriptor2;
  undefined1 local_68 [8];
  string descriptor1;
  allocator local_31;
  string local_30 [8];
  string pubkey_hex;
  Descriptor_Parse_Taproot_pubkey_Test *this_local;
  
  pubkey_hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_68,
             "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a)",
             (allocator *)(descriptor2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(descriptor2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_90,
             "tr(03ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a)",
             (allocator *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 0xf));
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_258,"",
             (allocator *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::DescriptorScriptReference::DescriptorScriptReference
            ((DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_5c8);
  node.parent_kind_.field_2._12_4_ = 2;
  cfd::core::DescriptorNode::DescriptorNode((DescriptorNode *)local_738);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_68,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReference
                (&local_c18,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      cfd::core::DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_c18);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_c18);
    }
  }
  else {
    testing::Message::Message(local_c28);
    testing::internal::AssertHelper::AssertHelper
              (&local_c30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x409,
               "Expected: script_ref = desc.GetReference() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_c30,local_c28);
    testing::internal::AssertHelper::~AssertHelper(&local_c30);
    testing::Message::~Message(local_c28);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetNode
                (&local_d98,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::DescriptorNode::operator=((DescriptorNode *)local_738,&local_d98);
      cfd::core::DescriptorNode::~DescriptorNode(&local_d98);
    }
  }
  else {
    testing::Message::Message(&local_da0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x40a,
               "Expected: node = desc.GetNode() doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_da0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_da0);
  }
  local_db9 = cfd::core::DescriptorScriptReference::HasKey
                        ((DescriptorScriptReference *)
                         &pubkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_db8,&local_db9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db8);
  if (!bVar1) {
    testing::Message::Message(&local_dc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_db8,
               (AssertionResult *)"script_ref.HasKey()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_dd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x40b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_dd0,&local_dc8);
    testing::internal::AssertHelper::~AssertHelper(&local_dd0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_dc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_db8);
  local_e01 = cfd::core::DescriptorScriptReference::HasAddress
                        ((DescriptorScriptReference *)
                         &pubkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e00,&local_e01,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e00);
  if (!bVar1) {
    testing::Message::Message(&local_e10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_e00,
               (AssertionResult *)"script_ref.HasAddress()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x40c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e18,&local_e10);
    testing::internal::AssertHelper::~AssertHelper(&local_e18);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e00);
  local_e50[1] = 1;
  local_e50[0] = cfd::core::DescriptorScriptReference::GetKeyNum
                           ((DescriptorScriptReference *)
                            &pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_e48,"1","script_ref.GetKeyNum()",(int *)(local_e50 + 1),
             local_e50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e48);
  if (!bVar1) {
    testing::Message::Message(&local_e58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x40d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_e58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_e58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e48);
  bVar1 = cfd::core::DescriptorScriptReference::HasChild
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_e71 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e70,&local_e71,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e70);
  if (!bVar1) {
    testing::Message::Message(&local_e80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_e70,
               (AssertionResult *)"script_ref.HasChild()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x40e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e88,&local_e80);
    testing::internal::AssertHelper::~AssertHelper(&local_e88);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_e80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e70);
  bVar1 = cfd::core::DescriptorScriptReference::HasReqNum
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_eb9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_eb8,&local_eb9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_eb8);
  if (!bVar1) {
    testing::Message::Message(&local_ec8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_eb8,
               (AssertionResult *)"script_ref.HasReqNum()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ed0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x40f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ed0,&local_ec8);
    testing::internal::AssertHelper::~AssertHelper(&local_ed0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_ec8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_eb8);
  bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_f01 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f00,&local_f01,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f00);
  if (!bVar1) {
    testing::Message::Message(&local_f10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_f00,
               (AssertionResult *)"script_ref.HasRedeemScript()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x410,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f18,&local_f10);
    testing::internal::AssertHelper::~AssertHelper(&local_f18);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_f10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f00);
  bVar1 = cfd::core::DescriptorScriptReference::HasScriptTree
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_f49 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f48,&local_f49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f48);
  if (!bVar1) {
    testing::Message::Message(&local_f58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f80,(internal *)local_f48,(AssertionResult *)"script_ref.HasScriptTree()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x411,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f60,&local_f58);
    testing::internal::AssertHelper::~AssertHelper(&local_f60);
    std::__cxx11::string::~string((string *)&local_f80);
    testing::Message::~Message(&local_f58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f48);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_fb8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_fb8);
      cfd::core::Script::~Script(&local_fb8);
    }
  }
  else {
    testing::Message::Message(&local_fc0);
    testing::internal::AssertHelper::AssertHelper
              (&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x412,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_fc8,&local_fc0);
    testing::internal::AssertHelper::~AssertHelper(&local_fc8);
    testing::Message::~Message(&local_fc0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_fe8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_258,(string *)&local_fe8);
      std::__cxx11::string::~string((string *)&local_fe8);
    }
  }
  else {
    testing::Message::Message(&local_ff0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x413,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_ff0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_ff0);
  }
  local_1010[1] = 7;
  local_1010[0] =
       cfd::core::DescriptorScriptReference::GetAddressType
                 ((DescriptorScriptReference *)
                  &pubkey.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_1008,"AddressType::kTaprootAddress",
             "script_ref.GetAddressType()",local_1010 + 1,local_1010);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1008);
  if (!bVar1) {
    testing::Message::Message(&local_1018);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1008);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x414,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1018);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1008);
  local_1038[1] = 6;
  local_1038[0] =
       cfd::core::DescriptorScriptReference::GetHashType
                 ((DescriptorScriptReference *)
                  &pubkey.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::HashType,cfd::core::HashType>
            ((EqHelper<false> *)local_1030,"HashType::kTaproot","script_ref.GetHashType()",
             local_1038 + 1,local_1038);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1030);
  if (!bVar1) {
    testing::Message::Message(&local_1040);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1030);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x415,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1040);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1040);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1030);
  cfd::core::DescriptorScriptReference::GenerateAddress
            (&local_11f0,
             (DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,node.parent_kind_.field_2._12_4_);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_1078,&local_11f0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1058,"script_ref.GenerateAddress(nettype).GetAddress().c_str()",
             "\"bcrt1pvv8jm84ye0xr7p9h8l2k58rm287nryk73cnw0nvfxyjfqqpn60gssz7u5f\"",pcVar2,
             "bcrt1pvv8jm84ye0xr7p9h8l2k58rm287nryk73cnw0nvfxyjfqqpn60gssz7u5f");
  std::__cxx11::string::~string((string *)&local_1078);
  cfd::core::Address::~Address(&local_11f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1058);
  if (!bVar1) {
    testing::Message::Message(&local_11f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1058);
    testing::internal::AssertHelper::AssertHelper
              (&local_1200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x417,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1200,&local_11f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1200);
    testing::Message::~Message(&local_11f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1058);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetKeyList
                (&local_1230,
                 (DescriptorScriptReference *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      this_00 = std::
                vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ::operator[](&local_1230,0);
      cfd::core::DescriptorKeyReference::GetSchnorrPubkey(&local_1218,this_00);
      cfd::core::SchnorrPubkey::operator=((SchnorrPubkey *)local_5c8,&local_1218);
      cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_1218);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector(&local_1230);
    }
  }
  else {
    testing::Message::Message(&local_1238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x418,
               "Expected: pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1238);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1250,"desc_str.c_str()","descriptor1.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1250);
  if (!bVar1) {
    testing::Message::Message(&local_1258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x419,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1250);
  cfd::core::Script::ToString_abi_cxx11_(&local_1290,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1270,"locking_script.ToString().c_str()",
             "\"1 630f2d9ea4cbcc3f04b73fd56a1c7b51fd3192de8e26e7cd893124900033d3d1\"",pcVar2,
             "1 630f2d9ea4cbcc3f04b73fd56a1c7b51fd3192de8e26e7cd893124900033d3d1");
  std::__cxx11::string::~string((string *)&local_1290);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1270);
  if (!bVar1) {
    testing::Message::Message(&local_1298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x41b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1270);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_12d0,(SchnorrPubkey *)local_5c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_12b0,"pubkey.GetHex().c_str()","pubkey_hex.c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_12d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12b0);
  if (!bVar1) {
    testing::Message::Message(&local_12d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_12e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x41d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_12e0,&local_12d8);
    testing::internal::AssertHelper::~AssertHelper(&local_12e0);
    testing::Message::~Message(&local_12d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12b0);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&gtest_ar__6.message_,(string *)local_90,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&gtest_ar__6.message_
            );
  cfd::core::Descriptor::~Descriptor((Descriptor *)&gtest_ar__6.message_);
  local_1459 = false;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1458,&local_1459,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1458);
  if (!bVar1) {
    testing::Message::Message(&local_1468);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&except_1,(internal *)local_1458,(AssertionResult *)0x6a1860,"false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x421,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1470,&local_1468);
    testing::internal::AssertHelper::~AssertHelper(&local_1470);
    std::__cxx11::string::~string((string *)&except_1);
    testing::Message::~Message(&local_1468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1458);
  cfd::core::DescriptorNode::~DescriptorNode((DescriptorNode *)local_738);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_5c8);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_258);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_Taproot_pubkey) {
  //   pubkey: '04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77',
  //   privkey: '5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC'
  std::string pubkey_hex = "ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a";
  std::string descriptor1 = "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a)";
  std::string descriptor2 = "tr(03ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  SchnorrPubkey pubkey;
  NetType nettype = NetType::kRegtest;
  DescriptorNode node;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }

  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_NO_THROW(node = desc.GetNode());
  EXPECT_TRUE(script_ref.HasKey());
  EXPECT_TRUE(script_ref.HasAddress());
  EXPECT_EQ(1, script_ref.GetKeyNum());
  EXPECT_FALSE(script_ref.HasChild());
  EXPECT_FALSE(script_ref.HasReqNum());
  EXPECT_FALSE(script_ref.HasRedeemScript());
  EXPECT_FALSE(script_ref.HasScriptTree());
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_EQ(AddressType::kTaprootAddress, script_ref.GetAddressType());
  EXPECT_EQ(HashType::kTaproot, script_ref.GetHashType());
  EXPECT_STREQ(script_ref.GenerateAddress(nettype).GetAddress().c_str(),
      "bcrt1pvv8jm84ye0xr7p9h8l2k58rm287nryk73cnw0nvfxyjfqqpn60gssz7u5f");
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "1 630f2d9ea4cbcc3f04b73fd56a1c7b51fd3192de8e26e7cd893124900033d3d1");
  EXPECT_STREQ(pubkey.GetHex().c_str(),
      pubkey_hex.c_str());

  try {
    desc = Descriptor::Parse(descriptor2);
    EXPECT_TRUE(false);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Failed to taproot key. taproot is xonly pubkey only.",
        except.what());
  }
}